

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.c
# Opt level: O2

void collect_mv_stats_b(MV_STATS *mv_stats,AV1_COMP *cpi,int mi_row,int mi_col)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  MB_MODE_INFO *mbmi;
  YV12_BUFFER_CONFIG *pYVar4;
  byte bVar5;
  uint8_t *puVar6;
  long lVar7;
  byte bVar8;
  uint8_t *puVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  int col;
  ulong uVar13;
  int col_1;
  uint uVar14;
  uint uVar15;
  MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame;
  uint uVar16;
  bool bVar17;
  MV cur_mv;
  MV ref_mv;
  int_mv local_40;
  int_mv local_3c;
  int local_38;
  int local_34;
  
  if ((mi_row < (cpi->common).mi_params.mi_rows) && (mi_col < (cpi->common).mi_params.mi_cols)) {
    mbmi = (cpi->common).mi_params.mi_grid_base[(cpi->common).mi_params.mi_stride * mi_row + mi_col]
    ;
    mbmi_ext_frame =
         (cpi->mbmi_ext_info).frame_base +
         ((mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                               [(cpi->common).mi_params.mi_alloc_bsize]) *
          (cpi->mbmi_ext_info).stride +
         mi_col / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                             [(cpi->common).mi_params.mi_alloc_bsize]);
    if (((mbmi->field_0xa7 & 0x80) == 0) && (mbmi->ref_frame[0] < '\x01')) {
      mv_stats->intra_count = mv_stats->intra_count + 1;
    }
    else {
      mv_stats->inter_count = mv_stats->inter_count + 1;
      cVar1 = mbmi->ref_frame[1];
      local_38 = mi_row;
      local_34 = mi_col;
      if ((mbmi->mode & 0xf7) == 0x10) {
        for (lVar7 = 0; (ulong)('\0' < cVar1) + 1 != lVar7; lVar7 = lVar7 + 1) {
          local_3c = get_ref_mv_for_mv_stats(mbmi,mbmi_ext_frame,(int)lVar7);
          local_40 = mbmi->mv[lVar7];
          keep_one_mv_stat(mv_stats,&local_3c.as_mv,&local_40.as_mv,cpi);
        }
      }
      else {
        bVar8 = mbmi->mode - 0x13;
        if (bVar8 < 4) {
          bVar17 = (bVar8 & 0xfd) == 0;
          mv_stats->default_mvs = mv_stats->default_mvs + 1;
          local_3c = get_ref_mv_for_mv_stats(mbmi,mbmi_ext_frame,(uint)bVar17);
          local_40 = mbmi->mv[bVar17];
          keep_one_mv_stat(mv_stats,&local_3c.as_mv,&local_40.as_mv,cpi);
        }
        else {
          mv_stats->default_mvs = mv_stats->default_mvs + (uint)('\0' < cVar1) + 1;
        }
      }
      bVar8 = block_size_high[mbmi->bsize];
      bVar2 = block_size_wide[mbmi->bsize];
      pYVar4 = cpi->source;
      iVar3 = (pYVar4->field_4).field_0.y_stride;
      lVar7 = (long)iVar3;
      local_34 = local_34 << 2;
      if ((pYVar4->flags & 8) == 0) {
        lVar10 = (long)(local_38 * 4 * iVar3);
        puVar6 = (pYVar4->field_5).buffers[0] + lVar10 + lVar7 + local_34;
        puVar9 = (pYVar4->field_5).buffers[0] + lVar10 + local_34 + 1;
        for (uVar11 = 0; uVar11 != (bVar8 - 1) + (uint)(bVar8 == 0); uVar11 = uVar11 + 1) {
          for (uVar13 = 0; (bVar2 - 1) + (uint)(bVar2 == 0) != uVar13; uVar13 = uVar13 + 1) {
            uVar14 = (uint)puVar9[uVar13] - (uint)puVar9[uVar13 - 1];
            uVar16 = -uVar14;
            if (0 < (int)uVar14) {
              uVar16 = uVar14;
            }
            uVar15 = (uint)puVar6[uVar13] - (uint)puVar9[uVar13 - 1];
            uVar14 = -uVar15;
            if (0 < (int)uVar15) {
              uVar14 = uVar15;
            }
            mv_stats->horz_text = mv_stats->horz_text + (uVar16 & 0xff);
            mv_stats->vert_text = mv_stats->vert_text + (uVar14 & 0xff);
            mv_stats->diag_text = mv_stats->diag_text + (uVar14 & 0xff) * (uVar16 & 0xff);
          }
          puVar6 = puVar6 + lVar7;
          puVar9 = puVar9 + lVar7;
        }
      }
      else {
        puVar6 = (pYVar4->field_5).field_0.y_buffer;
        lVar12 = (long)(local_38 * 4 * iVar3);
        bVar5 = (char)((cpi->common).seq_params)->bit_depth - 8;
        lVar10 = lVar12 * 2 + (long)puVar6 * 2 + (long)local_34 * 2 + lVar7 * 2;
        lVar12 = (long)local_34 * 2 + lVar12 * 2 + (long)puVar6 * 2 + 2;
        for (uVar11 = 0; uVar11 != (bVar8 - 1) + (uint)(bVar8 == 0); uVar11 = uVar11 + 1) {
          for (uVar13 = 0; (bVar2 - 1) + (uint)(bVar2 == 0) != uVar13; uVar13 = uVar13 + 1) {
            uVar15 = (uint)*(ushort *)(lVar12 + -2 + uVar13 * 2);
            uVar14 = *(ushort *)(lVar12 + uVar13 * 2) - uVar15;
            uVar16 = -uVar14;
            if (0 < (int)uVar14) {
              uVar16 = uVar14;
            }
            uVar14 = (uVar16 & 0xffff) >> (bVar5 & 0x1f);
            uVar15 = *(ushort *)(lVar10 + uVar13 * 2) - uVar15;
            uVar16 = -uVar15;
            if (0 < (int)uVar15) {
              uVar16 = uVar15;
            }
            uVar16 = (uVar16 & 0xffff) >> (bVar5 & 0x1f);
            mv_stats->horz_text = mv_stats->horz_text + uVar14;
            mv_stats->vert_text = mv_stats->vert_text + uVar16;
            mv_stats->diag_text = mv_stats->diag_text + uVar16 * uVar14;
          }
          lVar10 = lVar10 + lVar7 * 2;
          lVar12 = lVar12 + lVar7 * 2;
        }
      }
    }
  }
  return;
}

Assistant:

static inline void collect_mv_stats_b(MV_STATS *mv_stats, const AV1_COMP *cpi,
                                      int mi_row, int mi_col) {
  const AV1_COMMON *cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;

  if (mi_row >= mi_params->mi_rows || mi_col >= mi_params->mi_cols) {
    return;
  }

  const MB_MODE_INFO *mbmi =
      mi_params->mi_grid_base[mi_row * mi_params->mi_stride + mi_col];
  const MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame =
      cpi->mbmi_ext_info.frame_base +
      get_mi_ext_idx(mi_row, mi_col, cm->mi_params.mi_alloc_bsize,
                     cpi->mbmi_ext_info.stride);

  if (!is_inter_block(mbmi)) {
    mv_stats->intra_count++;
    return;
  }
  mv_stats->inter_count++;

  const PREDICTION_MODE mode = mbmi->mode;
  const int is_compound = has_second_ref(mbmi);

  if (mode == NEWMV || mode == NEW_NEWMV) {
    // All mvs are new
    for (int ref_idx = 0; ref_idx < 1 + is_compound; ++ref_idx) {
      const MV ref_mv =
          get_ref_mv_for_mv_stats(mbmi, mbmi_ext_frame, ref_idx).as_mv;
      const MV cur_mv = mbmi->mv[ref_idx].as_mv;
      keep_one_mv_stat(mv_stats, &ref_mv, &cur_mv, cpi);
    }
  } else if (mode == NEAREST_NEWMV || mode == NEAR_NEWMV ||
             mode == NEW_NEARESTMV || mode == NEW_NEARMV) {
    // has exactly one new_mv
    mv_stats->default_mvs += 1;

    const int ref_idx = (mode == NEAREST_NEWMV || mode == NEAR_NEWMV);
    const MV ref_mv =
        get_ref_mv_for_mv_stats(mbmi, mbmi_ext_frame, ref_idx).as_mv;
    const MV cur_mv = mbmi->mv[ref_idx].as_mv;

    keep_one_mv_stat(mv_stats, &ref_mv, &cur_mv, cpi);
  } else {
    // No new_mv
    mv_stats->default_mvs += 1 + is_compound;
  }

  // Add texture information
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int num_rows = block_size_high[bsize];
  const int num_cols = block_size_wide[bsize];
  const int y_stride = cpi->source->y_stride;
  const int px_row = 4 * mi_row, px_col = 4 * mi_col;
  const int buf_is_hbd = cpi->source->flags & YV12_FLAG_HIGHBITDEPTH;
  const int bd = cm->seq_params->bit_depth;
  if (buf_is_hbd) {
    uint16_t *source_buf =
        CONVERT_TO_SHORTPTR(cpi->source->y_buffer) + px_row * y_stride + px_col;
    for (int row = 0; row < num_rows - 1; row++) {
      for (int col = 0; col < num_cols - 1; col++) {
        const int offset = row * y_stride + col;
        const int horz_diff =
            abs(source_buf[offset + 1] - source_buf[offset]) >> (bd - 8);
        const int vert_diff =
            abs(source_buf[offset + y_stride] - source_buf[offset]) >> (bd - 8);
        mv_stats->horz_text += horz_diff;
        mv_stats->vert_text += vert_diff;
        mv_stats->diag_text += horz_diff * vert_diff;
      }
    }
  } else {
    uint8_t *source_buf = cpi->source->y_buffer + px_row * y_stride + px_col;
    for (int row = 0; row < num_rows - 1; row++) {
      for (int col = 0; col < num_cols - 1; col++) {
        const int offset = row * y_stride + col;
        const int horz_diff = abs(source_buf[offset + 1] - source_buf[offset]);
        const int vert_diff =
            abs(source_buf[offset + y_stride] - source_buf[offset]);
        mv_stats->horz_text += horz_diff;
        mv_stats->vert_text += vert_diff;
        mv_stats->diag_text += horz_diff * vert_diff;
      }
    }
  }
}